

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int next_token(parse_state *state)

{
  char cVar1;
  int iVar2;
  long lVar3;
  int t;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  long lVar8;
  
  iVar2 = state->nexttoken;
  if (iVar2 != 0) {
    state->nexttoken = 0;
    return iVar2;
  }
  for (pcVar4 = state->ptr; ((cVar7 = *pcVar4, cVar7 == '\t' || (cVar7 == '\r')) || (cVar7 == ' '));
      pcVar4 = pcVar4 + 1) {
  }
  if (cVar7 == '\0') {
LAB_00106792:
    state->ptr = pcVar4;
    return 0;
  }
  if (cVar7 == '\n') {
    state->line = state->line + 1;
    pcVar4 = pcVar4 + 1;
  }
  else {
    if (cVar7 != '#') {
      state->text = pcVar4;
      lVar3 = 1;
      pcVar6 = pcVar4;
      do {
        cVar7 = *pcVar4;
LAB_0010669e:
        pcVar5 = pcVar4;
        lVar8 = lVar3;
        if (cVar7 == '\\') {
          cVar1 = pcVar5[1];
          if (cVar1 == '\n') goto LAB_001066ca;
          if (cVar1 == '\r') goto code_r0x001066bc;
          if (cVar1 == '\0') goto LAB_0010679f;
          cVar7 = cVar1;
          if (cVar1 != '\\') {
            if (cVar1 == 'n') {
              cVar7 = '\n';
            }
            else {
              cVar7 = '\r';
              if ((cVar1 != 'r') && (lVar8 = 2, cVar7 = cVar1, cVar1 == 't')) {
                cVar7 = '\t';
                lVar8 = lVar3;
              }
            }
          }
          goto LAB_00106784;
        }
        if (cVar7 == '\0') goto LAB_001067a2;
        if (cVar7 == '\t') goto LAB_0010679f;
        if (cVar7 == '\n') {
          state->nexttoken = 2;
LAB_0010679f:
          pcVar5 = pcVar5 + 1;
LAB_001067a2:
          state->ptr = pcVar5;
          *pcVar6 = '\0';
          return 1;
        }
        if ((cVar7 == '\r') || (cVar7 == ' ')) goto LAB_0010679f;
        if (cVar7 == '\"') {
          while( true ) {
            pcVar4 = pcVar5 + 1;
            cVar7 = *pcVar4;
            if (cVar7 == '\"') break;
            if (cVar7 == '\0') goto LAB_00106792;
            *pcVar6 = cVar7;
            pcVar6 = pcVar6 + 1;
            pcVar5 = pcVar4;
          }
          pcVar4 = pcVar5 + 2;
        }
        else {
LAB_00106784:
          pcVar4 = pcVar5 + lVar8;
          *pcVar6 = cVar7;
          pcVar6 = pcVar6 + 1;
        }
      } while( true );
    }
    while ((cVar7 != '\0' && (cVar7 != '\n'))) {
      pcVar6 = pcVar4 + 1;
      pcVar4 = pcVar4 + 1;
      cVar7 = *pcVar6;
    }
    state->line = state->line + 1;
  }
  state->ptr = pcVar4;
  return 2;
code_r0x001066bc:
  cVar7 = pcVar5[2];
  pcVar4 = pcVar5 + 2;
  if (cVar7 == '\n') {
LAB_001066ca:
    state->line = state->line + 1;
    for (pcVar4 = pcVar5 + 2; (cVar7 = *pcVar4, cVar7 == ' ' || (cVar7 == '\t'));
        pcVar4 = pcVar4 + 1) {
    }
  }
  goto LAB_0010669e;
}

Assistant:

int next_token(struct parse_state *state)
{
    char *x = state->ptr;
    char *s;

    if (state->nexttoken) {
        int t = state->nexttoken;
        state->nexttoken = 0;
        return t;
    }

    for (;;) {
        switch (*x) {
        case 0:
            state->ptr = x;
            return T_EOF;
        case '\n':
            state->line++;
            x++;
            state->ptr = x;
            return T_NEWLINE;
        case ' ':
        case '\t':
        case '\r':
            x++;
            continue;
        case '#':
            while (*x && (*x != '\n')) x++;
            state->line++;
            state->ptr = x;
            return T_NEWLINE;
        default:
            goto text;
        }
    }

textdone:
    state->ptr = x;
    *s = 0;
    return T_TEXT;
text:
    state->text = s = x;
textresume:
    for (;;) {
        switch (*x) {
        case 0:
            goto textdone;
        case ' ':
        case '\t':
        case '\r':
            x++;
            goto textdone;
        case '\n':
            state->nexttoken = T_NEWLINE;
            x++;
            goto textdone;
        case '"':
            x++;
            for (;;) {
                switch (*x) {
                case 0:
                        /* unterminated quoted thing */
                    state->ptr = x;
                    return T_EOF;
                case '"':
                    x++;
                    goto textresume;
                default:
                    *s++ = *x++;
                }
            }
            break;
        case '\\':
            x++;
            switch (*x) {
            case 0:
                goto textdone;
            case 'n':
                *s++ = '\n';
                break;
            case 'r':
                *s++ = '\r';
                break;
            case 't':
                *s++ = '\t';
                break;
            case '\\':
                *s++ = '\\';
                break;
            case '\r':
                    /* \ <cr> <lf> -> line continuation */
                if (x[1] != '\n') {
                    x++;
                    continue;
                }
            case '\n':
                    /* \ <lf> -> line continuation */
                state->line++;
                x++;
                    /* eat any extra whitespace */
                while((*x == ' ') || (*x == '\t')) x++;
                continue;
            default:
                    /* unknown escape -- just copy */
                *s++ = *x++;
            }
            continue;
        default:
            *s++ = *x++;
        }
    }
    return T_EOF;
}